

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

bool __thiscall
SQCompilation::CodegenVisitor::IsGlobalConstant(CodegenVisitor *this,SQObject *name,SQObject *e)

{
  SQUnsignedInteger *pSVar1;
  SQTable *this_00;
  bool bVar2;
  SQObjectPtr val;
  SQObjectPtr local_38;
  SQObject local_28;
  
  local_28._unVal.pTable = (SQTable *)0x0;
  local_28._type = OT_NULL;
  local_28._flags = '\0';
  local_28._5_3_ = 0;
  this_00 = (this->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
  local_38.super_SQObject._type = name->_type;
  local_38.super_SQObject._flags = name->_flags;
  local_38.super_SQObject._5_3_ = *(undefined3 *)&name->field_0x5;
  local_38.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  if ((local_38.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  bVar2 = SQTable::Get(this_00,&local_38,(SQObjectPtr *)&local_28);
  SQObjectPtr::~SQObjectPtr(&local_38);
  if (bVar2) {
    e->_type = local_28._type;
    e->_flags = local_28._flags;
    *(undefined3 *)&e->field_0x5 = local_28._5_3_;
    (e->_unVal).pTable = (SQTable *)local_28._unVal;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_28);
  return bVar2;
}

Assistant:

bool CodegenVisitor::IsGlobalConstant(const SQObject &name, SQObject &e)
{
    SQObjectPtr val;
    if (_table(_ss(_vm)->_consts)->Get(name, val)) {
        e = val;
        return true;
    }
    return false;
}